

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_prop_id(CTcDataStream *this,uint prop_id)

{
  undefined4 in_ESI;
  CTcDataStream *in_RDI;
  ulong unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  CTcDataStream *id;
  
  if (G_keep_propfixups != 0) {
    id = in_RDI;
    get_ofs(in_RDI);
    CTcIdFixup::add_fixup
              ((CTcIdFixup **)this,(CTcDataStream *)CONCAT44(prop_id,in_stack_00000008),
               unaff_retaddr,(ulong)id);
  }
  write2((CTcDataStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void CTcDataStream::write_prop_id(uint prop_id)
{
    /* if there's an object ID fixup list, add this reference */
    if (G_keep_propfixups)
        CTcIdFixup::add_fixup(&G_propfixup, this, get_ofs(), prop_id);

    /* write the ID */
    write2(prop_id);
}